

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

void __thiscall cmCTestRunProcess::~cmCTestRunProcess(cmCTestRunProcess *this)

{
  if ((1 < this->PipeState + 1U) && (this->PipeState != 0xff)) {
    WaitForExit(this,(double *)0x0);
  }
  cmsysProcess_Delete(this->Process);
  std::__cxx11::string::~string((string *)&this->WorkingDirectory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->CommandLineStrings);
  return;
}

Assistant:

~cmCTestRunProcess()
  {
    if (this->PipeState != -1 && this->PipeState != cmsysProcess_Pipe_None &&
        this->PipeState != cmsysProcess_Pipe_Timeout) {
      this->WaitForExit();
    }
    cmsysProcess_Delete(this->Process);
  }